

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

bool llvm::APInt::tcIsZero(WordType *src,uint parts)

{
  uint local_20;
  uint i;
  uint parts_local;
  WordType *src_local;
  
  local_20 = 0;
  while( true ) {
    if (parts <= local_20) {
      return true;
    }
    if (src[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool APInt::tcIsZero(const WordType *src, unsigned parts) {
  for (unsigned i = 0; i < parts; i++)
    if (src[i])
      return false;

  return true;
}